

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

void __thiscall leveldb::MemTableIterator::SeekToLast(MemTableIterator *this)

{
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *pSVar1;
  __pointer_type pNVar2;
  Node *pNVar3;
  int iVar4;
  Node *pNVar5;
  bool bVar6;
  
  pSVar1 = (this->iter_).list_;
  iVar4 = (pSVar1->max_height_).super___atomic_base<int>._M_i + -1;
  pNVar2 = pSVar1->head_;
  do {
    pNVar3 = pNVar2;
    for (pNVar5 = (Node *)(pNVar3->next_ + iVar4); pNVar2 = ((__base_type *)&pNVar5->key)->_M_p,
        pNVar2 == (__pointer_type)0x0; pNVar5 = (Node *)((long)(pNVar5 + 0xffffffffffffffff) + 8)) {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) {
        pNVar5 = (Node *)0x0;
        if (pNVar3 != ((this->iter_).list_)->head_) {
          pNVar5 = pNVar3;
        }
        (this->iter_).node_ = pNVar5;
        return;
      }
    }
  } while( true );
}

Assistant:

inline void SkipList<Key, Comparator>::Iterator::SeekToLast() {
  node_ = list_->FindLast();
  if (node_ == list_->head_) {
    node_ = nullptr;
  }
}